

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins.c
# Opt level: O0

void fsnav_ins_set_yaw_zero(void)

{
  if (((fsnav->imu != (fsnav_imu *)0x0) && (fsnav->mode != 0)) && (-1 < fsnav->mode)) {
    (fsnav->imu->sol).rpy_valid = '\0';
    (fsnav->imu->sol).L_valid = '\0';
    (fsnav->imu->sol).rpy[2] = 0.0;
    fsnav_linal_rpy2mat((fsnav->imu->sol).L,(fsnav->imu->sol).rpy);
    (fsnav->imu->sol).rpy_valid = '\x01';
    (fsnav->imu->sol).L_valid = '\x01';
  }
  return;
}

Assistant:

void fsnav_ins_set_yaw_zero(void)
{
	// проверка инерциальной подсистемы на шине
	if (fsnav->imu == NULL)
		return;

	// инициализация
	if (fsnav->mode == 0) {}

	// завершение работы
	else if (fsnav->mode < 0) {}

	// операции на каждом шаге
	else {
		// сброс флагов достоверности
		fsnav->imu->sol.rpy_valid = 0;
		fsnav->imu->sol.  L_valid = 0;

		// обнуление угла курса
		fsnav->imu->sol.rpy[2] = 0.0;
		fsnav_linal_rpy2mat(fsnav->imu->sol.L, fsnav->imu->sol.rpy);

		// установка флагов достоверности
		fsnav->imu->sol.rpy_valid = 1;
		fsnav->imu->sol.  L_valid = 1;
	}
}